

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeMeshes.cpp
# Opt level: O0

void __thiscall
Assimp::OptimizeMeshesProcess::FindInstancedMeshes(OptimizeMeshesProcess *this,aiNode *pNode)

{
  reference pvVar1;
  uint local_20;
  uint local_1c;
  uint i_1;
  uint i;
  aiNode *pNode_local;
  OptimizeMeshesProcess *this_local;
  
  for (local_1c = 0; local_1c < pNode->mNumMeshes; local_1c = local_1c + 1) {
    pvVar1 = std::
             vector<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
             ::operator[](&this->meshes,(ulong)pNode->mMeshes[local_1c]);
    pvVar1->instance_cnt = pvVar1->instance_cnt + 1;
  }
  for (local_20 = 0; local_20 < pNode->mNumChildren; local_20 = local_20 + 1) {
    FindInstancedMeshes(this,pNode->mChildren[local_20]);
  }
  return;
}

Assistant:

void OptimizeMeshesProcess::FindInstancedMeshes (aiNode* pNode)
{
    for( unsigned int i = 0; i < pNode->mNumMeshes; ++i ) {
        ++meshes[ pNode->mMeshes[ i ] ].instance_cnt;
    }

    for( unsigned int i = 0; i < pNode->mNumChildren; ++i ) {
        FindInstancedMeshes( pNode->mChildren[ i ] );
    }
}